

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

bool cmTarFilesFrom(string *file,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *files)

{
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string line;
  ostringstream e_1;
  ifstream fin;
  string local_3f8;
  string *local_3d8;
  string local_3d0;
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [112];
  ios_base local_1c8 [408];
  
  bVar2 = cmsys::SystemTools::FileIsDirectory(file);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"-E tar --files-from= file \'",0x1b);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_238,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' is a directory",0x10);
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error((string *)local_3b0);
    if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
    bVar2 = false;
  }
  else {
    local_3d8 = file;
    std::ifstream::ifstream(local_238,(file->_M_dataplus)._M_p,_S_in);
    if (((byte)(*(_func_int **)(local_238._0_8_ + -0x18))[(long)(local_238 + 0x20)] & 5) == 0) {
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      local_3f8._M_string_length = 0;
      local_3f8.field_2._M_local_buf[0] = '\0';
      while( true ) {
        bVar2 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)local_238,&local_3f8,(bool *)0x0,-1);
        _Var1._M_p = local_3f8._M_dataplus._M_p;
        if (!bVar2) break;
        if (local_3f8._M_string_length != 0) {
          iVar3 = strncmp(local_3f8._M_dataplus._M_p,"--add-file=",0xb);
          if (iVar3 == 0) {
            std::__cxx11::string::substr((ulong)local_3b0,(ulong)&local_3f8);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b0);
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
            }
          }
          else {
            if (*_Var1._M_p == '-') {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_3b0,"-E tar --files-from=\'",0x15);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_3b0,(local_3d8->_M_dataplus)._M_p,
                                  local_3d8->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar4,"\' file invalid line:\n",0x15);
              poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar4,local_3f8._M_dataplus._M_p,local_3f8._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
              std::__cxx11::stringbuf::str();
              cmSystemTools::Error(&local_3d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                operator_delete(local_3d0._M_dataplus._M_p,
                                local_3d0.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
              std::ios_base::~ios_base(local_340);
              break;
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,&local_3f8);
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.field_2._M_local_buf[0]) + 1);
      }
      bVar2 = !bVar2;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3b0,"-E tar --files-from= file \'",0x1b);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_3b0,(local_3d8->_M_dataplus)._M_p,
                          local_3d8->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\' not found",0xb);
      std::__cxx11::stringbuf::str();
      cmSystemTools::Error(&local_3f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
      std::ios_base::~ios_base(local_340);
      bVar2 = false;
    }
    std::ifstream::~ifstream(local_238);
  }
  return bVar2;
}

Assistant:

static bool cmTarFilesFrom(std::string const& file,
                           std::vector<std::string>& files)
{
  if (cmSystemTools::FileIsDirectory(file)) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' is a directory";
    cmSystemTools::Error(e.str());
    return false;
  }
  cmsys::ifstream fin(file.c_str());
  if (!fin) {
    std::ostringstream e;
    e << "-E tar --files-from= file '" << file << "' not found";
    cmSystemTools::Error(e.str());
    return false;
  }
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (line.empty()) {
      continue;
    }
    if (cmHasLiteralPrefix(line, "--add-file=")) {
      files.push_back(line.substr(11));
    } else if (cmHasLiteralPrefix(line, "-")) {
      std::ostringstream e;
      e << "-E tar --files-from='" << file << "' file invalid line:\n"
        << line << "\n";
      cmSystemTools::Error(e.str());
      return false;
    } else {
      files.push_back(line);
    }
  }
  return true;
}